

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

Data parseWatsonFromString(char *str,size_t len)

{
  VM vm;
  Data pvVar1;
  size_t sVar2;
  
  vm = newBufferVM(LexerA,str,len);
  if (len != 0) {
    sVar2 = 0;
    do {
      parseCommand(vm,str[sVar2]);
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  pvVar1 = pop(vm->stack);
  freeVM(vm);
  return pvVar1;
}

Assistant:

Data parseWatsonFromString(const char *str, size_t len) {
    VM vm = newBufferVM(LexerA, (char *) str, len);
    size_t i;
    for (i = 0; i < len; i++)parseCommand(vm, str[i]);
    Data d = pop(vm->stack);
    freeVM(vm);
    return d;
}